

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_encoder.h
# Opt level: O1

void __thiscall draco::MeshEdgebreakerTraversalEncoder::Start(MeshEdgebreakerTraversalEncoder *this)

{
  long *plVar1;
  pointer __p;
  RAnsBitEncoder *pRVar2;
  long lVar3;
  long lVar4;
  RAnsBitEncoder *local_38;
  
  RAnsBitEncoder::StartEncoding(&this->start_face_encoder_);
  lVar4 = (long)this->num_attribute_data_;
  if (0 < lVar4) {
    plVar1 = (long *)operator_new__(lVar4 * 0x38 + 8);
    *plVar1 = lVar4;
    lVar3 = 0;
    pRVar2 = (RAnsBitEncoder *)(plVar1 + 1);
    do {
      RAnsBitEncoder::RAnsBitEncoder(pRVar2);
      lVar3 = lVar3 + -0x38;
      pRVar2 = pRVar2 + 1;
    } while (lVar4 * -0x38 - lVar3 != 0);
    local_38 = (RAnsBitEncoder *)0x0;
    pRVar2 = (this->attribute_connectivity_encoders_)._M_t.
             super___uniq_ptr_impl<draco::RAnsBitEncoder,_std::default_delete<draco::RAnsBitEncoder[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_draco::RAnsBitEncoder_*,_std::default_delete<draco::RAnsBitEncoder[]>_>
             .super__Head_base<0UL,_draco::RAnsBitEncoder_*,_false>._M_head_impl;
    (this->attribute_connectivity_encoders_)._M_t.
    super___uniq_ptr_impl<draco::RAnsBitEncoder,_std::default_delete<draco::RAnsBitEncoder[]>_>._M_t
    .super__Tuple_impl<0UL,_draco::RAnsBitEncoder_*,_std::default_delete<draco::RAnsBitEncoder[]>_>.
    super__Head_base<0UL,_draco::RAnsBitEncoder_*,_false>._M_head_impl =
         (RAnsBitEncoder *)(plVar1 + 1);
    if (pRVar2 != (RAnsBitEncoder *)0x0) {
      std::default_delete<draco::RAnsBitEncoder[]>::operator()
                ((default_delete<draco::RAnsBitEncoder[]> *)&this->attribute_connectivity_encoders_,
                 pRVar2);
    }
    if (local_38 != (RAnsBitEncoder *)0x0) {
      std::default_delete<draco::RAnsBitEncoder[]>::operator()
                ((default_delete<draco::RAnsBitEncoder[]> *)&local_38,local_38);
    }
    if (0 < this->num_attribute_data_) {
      lVar4 = 0;
      lVar3 = 0;
      do {
        RAnsBitEncoder::StartEncoding
                  ((RAnsBitEncoder *)
                   ((long)&(((this->attribute_connectivity_encoders_)._M_t.
                             super___uniq_ptr_impl<draco::RAnsBitEncoder,_std::default_delete<draco::RAnsBitEncoder[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_draco::RAnsBitEncoder_*,_std::default_delete<draco::RAnsBitEncoder[]>_>
                             .super__Head_base<0UL,_draco::RAnsBitEncoder_*,_false>._M_head_impl)->
                           bit_counts_).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + lVar4
                   ));
        lVar3 = lVar3 + 1;
        lVar4 = lVar4 + 0x38;
      } while (lVar3 < this->num_attribute_data_);
    }
  }
  return;
}

Assistant:

void Start() {
    start_face_encoder_.StartEncoding();
    if (num_attribute_data_ > 0) {
      // Init and start arithmetic encoders for storing configuration types
      // of non-position attributes.
      attribute_connectivity_encoders_ = std::unique_ptr<BinaryEncoder[]>(
          new BinaryEncoder[num_attribute_data_]);
      for (int i = 0; i < num_attribute_data_; ++i) {
        attribute_connectivity_encoders_[i].StartEncoding();
      }
    }
  }